

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client_test.cpp
# Opt level: O0

int main(void)

{
  anon_class_1_0_00000001 local_2b9;
  BoolFunctor local_2b8;
  ReplyHandler local_298;
  anon_class_1_0_00000001 local_271;
  undefined1 local_270 [7];
  anon_class_1_0_00000001 handler;
  Request request;
  string local_1c8;
  undefined1 local_1a8 [8];
  HttpClient client;
  allocator local_b9;
  string local_b8;
  undefined1 local_98 [8];
  EventLoopGroup group;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"EPOLL",&local_b9);
  Liby::EventLoopGroup::EventLoopGroup((EventLoopGroup *)local_98,0,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c8,"www.dotamax.com",
             (allocator *)((long)&request.body_.capacity_ + 7));
  Liby::http::HttpClient::HttpClient((HttpClient *)local_1a8,(EventLoopGroup *)local_98,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&request.body_.capacity_ + 7));
  Liby::http::Request::Request((Request *)local_270);
  local_270._0_4_ = 1;
  std::__cxx11::string::operator=((string *)&request,"/");
  std::function<void(Liby::http::Reply&)>::function<main::__0&,void>
            ((function<void(Liby::http::Reply&)> *)&local_298,&local_271);
  Liby::http::HttpClient::get((HttpClient *)local_1a8,(Request *)local_270,&local_298);
  std::function<void_(Liby::http::Reply_&)>::~function(&local_298);
  std::function<bool()>::
  function<Liby::EventLoopGroup::run(std::function<bool()>)::_default_arg_1_::_lambda()_1_,void>
            ((function<bool()> *)&local_2b8,&local_2b9);
  Liby::EventLoopGroup::run((EventLoopGroup *)local_98,&local_2b8);
  std::function<bool_()>::~function(&local_2b8);
  Liby::http::Request::~Request((Request *)local_270);
  Liby::http::HttpClient::~HttpClient((HttpClient *)local_1a8);
  Liby::EventLoopGroup::~EventLoopGroup((EventLoopGroup *)local_98);
  return 0;
}

Assistant:

int main(void) {
    EventLoopGroup group;
    HttpClient client(group, "www.dotamax.com");
    Request request;
    request.method_ = GET;
    request.uri_ = "/";
    auto handler = [](Reply &reply) {
        std::cout << reply.toString() << std::endl;
    };
    client.get(request, handler);
    group.run();
}